

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

int doredraw(void)

{
  boolean bVar1;
  int local_14;
  int local_10;
  int y;
  int x;
  
  if (u.ux != '\0') {
    if ((u._1052_1_ & 1) == 0) {
      if ((((byte)u._1052_1_ >> 1 & 1) == 0) ||
         (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 != '\0')) {
        if (((byte)u._1052_1_ >> 5 & 1) == 0) {
          vision_recalc(2);
          for (local_10 = 1; local_10 < 0x50; local_10 = local_10 + 1) {
            for (local_14 = 0; local_14 < 0x15; local_14 = local_14 + 1) {
              dbuf_set_loc(local_10,local_14);
            }
          }
          vision_recalc(0);
          see_monsters();
          iflags.botl = '\x01';
        }
        else {
          under_ground(1);
        }
      }
      else {
        under_water(1);
      }
    }
    else {
      swallowed(1);
    }
  }
  return 0;
}

Assistant:

int doredraw(void)
{
    int x,y;

    if (!u.ux)
	return 0; /* display isn't ready yet */

    if (u.uswallow) {
	swallowed(1);
	return 0;
    }
    if (Underwater && !Is_waterlevel(&u.uz)) {
	under_water(1);
	return 0;
    }
    if (u.uburied) {
	under_ground(1);
	return 0;
    }

    /* shut down vision */
    vision_recalc(2);

    /* display memory */
    for (x = 1; x < COLNO; x++) {
	for (y = 0; y < ROWNO; y++)
	    dbuf_set_loc(x, y);
    }

    /* see what is to be seen */
    vision_recalc(0);

    /* overlay with monsters */
    see_monsters();

    iflags.botl = 1;	/* force a redraw of the bottom line */
    return 0;
}